

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O3

uint __thiscall xercesc_4_0::CMStateSetEnumerator::nextElement(CMStateSetEnumerator *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    uVar1 = (uint)(1L << ((byte)lVar3 & 0x3f));
    if ((this->fLastValue & uVar1) != 0) {
      uVar2 = (int)lVar3 + (int)this->fIndexCount;
      uVar1 = this->fLastValue & ~uVar1;
      this->fLastValue = uVar1;
      if (uVar1 != 0) {
        return uVar2;
      }
      findNext(this);
      return uVar2;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  return 0;
}

Assistant:

unsigned int nextElement()
    {
        for(int i=0;i<32;i++)
        {
            XMLInt32 mask=1UL << i;
            if(fLastValue & mask)
            {
                fLastValue &= ~mask;
                unsigned int retVal=(unsigned int)fIndexCount+i;
                if(fLastValue==0)
                    findNext();
                return retVal;
            }
        }
        return 0;
    }